

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestCase::AddTestInfo(TestCase *this,TestInfo *test_info)

{
  TestInfo *local_20;
  TestInfo *test_info_local;
  
  local_20 = test_info;
  std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::push_back
            (&this->test_info_list_,&local_20);
  test_info_local._4_4_ =
       (undefined4)
       ((ulong)((long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&this->test_indices_,(int *)((long)&test_info_local + 4));
  return;
}

Assistant:

void TestCase::AddTestInfo(TestInfo * test_info) {
  test_info_list_.push_back(test_info);
  test_indices_.push_back(static_cast<int>(test_indices_.size()));
}